

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.cc
# Opt level: O2

void evp_pkey_set_method(EVP_PKEY *pkey,EVP_PKEY_ASN1_METHOD *method)

{
  free_it(pkey);
  pkey->ameth = method;
  pkey->type = method->pkey_id;
  return;
}

Assistant:

void evp_pkey_set_method(EVP_PKEY *pkey, const EVP_PKEY_ASN1_METHOD *method) {
  free_it(pkey);
  pkey->ameth = method;
  pkey->type = pkey->ameth->pkey_id;
}